

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_rtti.cpp
# Opt level: O0

void get_type_info(void)

{
  bool bVar1;
  time_t tVar2;
  ostream *poVar3;
  Grand *pGVar4;
  char *pcVar5;
  long *local_40;
  int local_1c;
  int i;
  Superb *ps;
  Grand *pg;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\n Loop ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
    std::operator<<(poVar3,":\n");
    pGVar4 = get_one();
    poVar3 = std::operator<<((ostream *)&std::cout,"Now processing type ");
    if (pGVar4 == (Grand *)0x0) {
      __cxa_bad_typeid();
    }
    pcVar5 = std::type_info::name((type_info *)pGVar4->_vptr_Grand[-1]);
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::operator<<(poVar3,"\n");
    (**pGVar4->_vptr_Grand)();
    if (pGVar4 == (Grand *)0x0) {
      local_40 = (long *)0x0;
    }
    else {
      local_40 = (long *)__dynamic_cast(pGVar4,&L15_5::Grand::typeinfo,&L15_5::Superb::typeinfo,0);
    }
    if (local_40 != (long *)0x0) {
      (**(code **)(*local_40 + 0x10))();
    }
    if (pGVar4 == (Grand *)0x0) {
      __cxa_bad_typeid();
    }
    bVar1 = std::type_info::operator==
                      ((type_info *)&L15_5::Magnificent::typeinfo,
                       (type_info *)pGVar4->_vptr_Grand[-1]);
    if (bVar1) {
      std::operator<<((ostream *)&std::cout,"Yes, you area really magnificent.......\n");
    }
  }
  return;
}

Assistant:

void get_type_info() {
    using namespace L15_5;
    using std::cout;
    using std::endl;

    srand(time(0));
    Grand * pg;
    Superb * ps;
    for (int i = 0; i < 5; i++) {
        cout << "\n Loop " << i << ":\n";
        pg = get_one();
        cout << "Now processing type " << typeid(*pg).name() << "\n";
        pg ->speak();
        if (ps = dynamic_cast<Superb *>(pg)) {
            ps->say();
        }
        //  similar to 'pg instanceof Magnificent'
        if (typeid(Magnificent) == typeid(*pg)) {
            cout << "Yes, you area really magnificent.......\n";
        }
    }
}